

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

void __thiscall CholeskyFactor::recompute(CholeskyFactor *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar1;
  MatrixBase *this_01;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  undefined1 *in_RDI;
  size_t k_1;
  size_t k;
  double sum;
  size_t row;
  size_t col;
  HighsInt j;
  HighsInt i_1;
  MatrixBase *temp_t;
  HighsInt i;
  QpVector buffer_ZtQi;
  QpVector buffer_Qcol;
  Matrix temp;
  HighsInt dim_ns;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  orig;
  size_type in_stack_fffffffffffffdc8;
  Matrix *in_stack_fffffffffffffdd0;
  allocator_type *in_stack_fffffffffffffdd8;
  value_type vVar5;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf0;
  ulong uVar6;
  QpVector *in_stack_fffffffffffffdf8;
  Matrix *in_stack_fffffffffffffe00;
  QpVector *in_stack_fffffffffffffe08;
  Basis *in_stack_fffffffffffffe10;
  Basis *this_02;
  QpVector *in_stack_fffffffffffffe18;
  CholeskyFactor *in_stack_fffffffffffffe20;
  ulong local_1b8;
  ulong local_1b0;
  double local_1a8;
  ulong local_1a0;
  ulong local_198;
  int local_190;
  int local_18c;
  int local_17c;
  int local_178;
  vector<int,_std::allocator<int>_> vStack_170;
  QpVector aQStack_158 [4];
  undefined8 local_58;
  int local_24;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_20;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x761ef9);
  this_00 = Basis::getinactive(*(Basis **)(in_RDI + 0x10));
  sVar1 = std::vector<int,_std::allocator<int>_>::size(this_00);
  local_24 = (int)sVar1;
  *(undefined4 *)(in_RDI + 4) = 0;
  local_58 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x761f59);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (value_type_conflict1 *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::assign((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(value_type *)0x761f94);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffde0);
  std::allocator<double>::~allocator((allocator<double> *)0x761fb0);
  resize(in_stack_fffffffffffffe20,(HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  Matrix::Matrix(in_stack_fffffffffffffdd0,(HighsInt)(in_stack_fffffffffffffdc8 >> 0x20),
                 (HighsInt)in_stack_fffffffffffffdc8);
  QpVector::QpVector((QpVector *)in_stack_fffffffffffffe00,
                     (HighsInt)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffffe00,
                     (HighsInt)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  for (local_17c = 0; local_17c < *(int *)(*(long *)(in_RDI + 8) + 4); local_17c = local_17c + 1) {
    MatrixBase::extractcol
              ((MatrixBase *)in_stack_fffffffffffffe20,
               (HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20),
               (QpVector *)in_stack_fffffffffffffe10);
    Basis::Ztprod(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                  (QpVector *)in_stack_fffffffffffffe00,
                  SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0),
                  (HighsInt)in_stack_fffffffffffffdf8);
    Matrix::append(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  this_01 = Matrix::t(in_stack_fffffffffffffdd0);
  for (local_18c = 0; local_18c < local_24; local_18c = local_18c + 1) {
    this_02 = *(Basis **)(in_RDI + 0x10);
    in_stack_fffffffffffffe18 =
         MatrixBase::extractcol
                   (this_01,(HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20),(QpVector *)this_02
                   );
    Basis::Ztprod(this_02,in_stack_fffffffffffffe08,(QpVector *)in_stack_fffffffffffffe00,
                  SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0),
                  (HighsInt)in_stack_fffffffffffffdf8);
    for (local_190 = 0; local_190 < local_178; local_190 = local_190 + 1) {
      in_stack_fffffffffffffdf8 = aQStack_158;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_170,(long)local_190);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdf8,
                          (long)*pvVar2);
      in_stack_fffffffffffffe08 = (QpVector *)*pvVar3;
      in_stack_fffffffffffffe00 =
           (Matrix *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&local_20,(long)local_18c);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_170,(long)local_190);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00,
                          (long)*pvVar2);
      *pvVar3 = (value_type)in_stack_fffffffffffffe08;
    }
  }
  local_198 = 0;
  while( true ) {
    uVar6 = local_198;
    sVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&local_20);
    if (sVar1 <= uVar6) break;
    for (local_1a0 = 0; local_1a0 <= local_198; local_1a0 = local_1a0 + 1) {
      local_1a8 = 0.0;
      if (local_1a0 == local_198) {
        for (local_1b0 = 0; local_1b0 < local_1a0; local_1b0 = local_1b0 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                              local_1b0 * (long)*(int *)(in_RDI + 0x1c) + local_1a0);
          vVar5 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                              local_1b0 * (long)*(int *)(in_RDI + 0x1c) + local_1a0);
          local_1a8 = vVar5 * *pvVar3 + local_1a8;
        }
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_20,local_1a0);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,local_1a0);
        in_stack_fffffffffffffde0 =
             (vector<double,_std::allocator<double>_> *)sqrt(*pvVar3 - local_1a8);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            local_1a0 * (long)*(int *)(in_RDI + 0x1c) + local_1a0);
        *pvVar3 = (value_type)in_stack_fffffffffffffde0;
      }
      else {
        for (local_1b8 = 0; local_1b8 < local_1a0; local_1b8 = local_1b8 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                              local_1b8 * (long)*(int *)(in_RDI + 0x1c) + local_198);
          vVar5 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                              local_1b8 * (long)*(int *)(in_RDI + 0x1c) + local_1a0);
          local_1a8 = vVar5 * *pvVar3 + local_1a8;
        }
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_20,local_198);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,local_1a0);
        local_1a8 = *pvVar3 - local_1a8;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            local_1a0 * (long)*(int *)(in_RDI + 0x1c) + local_1a0);
        in_stack_fffffffffffffdd0 = (Matrix *)(local_1a8 / *pvVar3);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            local_1a0 * (long)*(int *)(in_RDI + 0x1c) + local_198);
        *pvVar3 = (value_type)in_stack_fffffffffffffdd0;
      }
    }
    local_198 = local_198 + 1;
  }
  *(int *)(in_RDI + 0x18) = local_24;
  *in_RDI = 1;
  QpVector::~QpVector((QpVector *)in_stack_fffffffffffffdd0);
  QpVector::~QpVector((QpVector *)in_stack_fffffffffffffdd0);
  Matrix::~Matrix(in_stack_fffffffffffffdd0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffde0);
  return;
}

Assistant:

void recompute() {
    std::vector<std::vector<double>> orig;
    HighsInt dim_ns = basis.getinactive().size();
    numberofreduces = 0;

    orig.assign(dim_ns, std::vector<double>(dim_ns, 0.0));
    resize(dim_ns);

    Matrix temp(dim_ns, 0);

    QpVector buffer_Qcol(runtime.instance.num_var);
    QpVector buffer_ZtQi(dim_ns);
    for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
      runtime.instance.Q.mat.extractcol(i, buffer_Qcol);
      basis.Ztprod(buffer_Qcol, buffer_ZtQi);
      temp.append(buffer_ZtQi);
    }
    MatrixBase& temp_t = temp.t();
    for (HighsInt i = 0; i < dim_ns; i++) {
      basis.Ztprod(temp_t.extractcol(i, buffer_Qcol), buffer_ZtQi);
      for (HighsInt j = 0; j < buffer_ZtQi.num_nz; j++) {
        orig[i][buffer_ZtQi.index[j]] = buffer_ZtQi.value[buffer_ZtQi.index[j]];
      }
    }

    for (size_t col = 0; col < orig.size(); col++) {
      for (size_t row = 0; row <= col; row++) {
        double sum = 0;
        if (row == col) {
          for (size_t k = 0; k < row; k++)
            sum += L[k * current_k_max + row] * L[k * current_k_max + row];
          L[row * current_k_max + row] = sqrt(orig[row][row] - sum);
        } else {
          for (size_t k = 0; k < row; k++)
            sum += (L[k * current_k_max + col] * L[k * current_k_max + row]);
          L[row * current_k_max + col] =
              (orig[col][row] - sum) / L[row * current_k_max + row];
        }
      }
    }
    current_k = dim_ns;
    uptodate = true;
  }